

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,LabelName *name)

{
  size_type sVar1;
  mapped_type *pmVar2;
  string mangled;
  
  std::operator+(&mangled,(name->super_LocalName).name,'m');
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->local_sym_map_,&mangled);
  if (sVar1 == 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->local_sym_map_,&mangled);
    WriteData(this,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("local_sym_map_.count(mangled) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x3b9,"void wabt::(anonymous namespace)::CWriter::Write(const LabelName &)");
}

Assistant:

void CWriter::Write(const LabelName& name) {
  std::string mangled = name.name + kLabelSuffix;
  assert(local_sym_map_.count(mangled) == 1);
  Write(local_sym_map_[mangled]);
}